

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

AddrOpnd * __thiscall
IRBuilder::BuildAuxArrayOpnd(IRBuilder *this,AuxArrayValue auxArrayType,uint32 auxArrayOffset)

{
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *pJVar3;
  intptr_t address;
  AddrOpnd *pAVar4;
  void *pvVar5;
  undefined4 *puVar6;
  
  if (auxArrayType < (AuxVarArrayVarCount|AuxFloatArray)) {
    pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    address = JITTimeFunctionBody::GetAuxDataAddr(pJVar3,auxArrayOffset);
    pAVar4 = IR::AddrOpnd::New(address,AddrOpndKindDynamicAuxBufferRef,this->m_func,false,(Var)0x0);
    pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    pvVar5 = JITTimeFunctionBody::ReadFromAuxData(pJVar3,auxArrayOffset);
    pAVar4->m_metadata = pvVar5;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1e67,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    pAVar4 = (AddrOpnd *)0x0;
  }
  return pAVar4;
}

Assistant:

IR::AddrOpnd *
IRBuilder::BuildAuxArrayOpnd(AuxArrayValue auxArrayType, uint32 auxArrayOffset)
{
    switch (auxArrayType)
    {
    case AuxArrayValue::AuxPropertyIdArray:
    case AuxArrayValue::AuxIntArray:
    case AuxArrayValue::AuxFloatArray:
    case AuxArrayValue::AuxVarsArray:
    case AuxArrayValue::AuxFuncInfoArray:
    case AuxArrayValue::AuxVarArrayVarCount:
    {
        IR::AddrOpnd * opnd = IR::AddrOpnd::New(m_func->GetJITFunctionBody()->GetAuxDataAddr(auxArrayOffset), IR::AddrOpndKindDynamicAuxBufferRef, m_func);
        opnd->m_metadata = m_func->GetJITFunctionBody()->ReadFromAuxData(auxArrayOffset);
        return opnd;
    }
    default:
        Assert(UNREACHED);
        return nullptr;
    }
}